

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

void ly_ctx_set_module_imp_clb(ly_ctx *ctx,ly_module_imp_clb clb,void *user_data)

{
  lyd_node *plVar1;
  long lVar2;
  void *local_48;
  void *local_38;
  uint64_t u;
  lys_module *mod;
  uint32_t v;
  void *user_data_local;
  ly_module_imp_clb clb_local;
  ly_ctx *ctx_local;
  
  if (ctx == (ly_ctx *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","ctx",
           "ly_ctx_set_module_imp_clb");
  }
  else {
    ctx->imp_clb = clb;
    ctx->imp_clb_data = user_data;
    for (mod._4_4_ = 0; mod._4_4_ < (ctx->list).count; mod._4_4_ = mod._4_4_ + 1) {
      plVar1 = (ctx->list).field_2.dnodes[mod._4_4_];
      *(byte *)((long)&plVar1[2].schema + 2) = *(byte *)((long)&plVar1[2].schema + 2) & 0xf7;
      if ((plVar1[1].next != (lyd_node *)0x0) && ((plVar1[1].next)->next != (lyd_node *)0x0)) {
        local_38 = (void *)0x0;
        while( true ) {
          if ((plVar1[1].next)->next == (lyd_node *)0x0) {
            local_48 = (void *)0x0;
          }
          else {
            local_48 = (plVar1[1].next)->next[-1].priv;
          }
          if (local_48 <= local_38) break;
          lVar2 = *(long *)((plVar1[1].next)->next + (long)local_38);
          *(byte *)(lVar2 + 0x79) =
               *(byte *)(lVar2 + 0x79) & 0xf3 | (*(byte *)(lVar2 + 0x79) >> 2 & 3) << 2;
          local_38 = (void *)((long)local_38 + 1);
        }
      }
    }
  }
  return;
}

Assistant:

LIBYANG_API_DEF void
ly_ctx_set_module_imp_clb(struct ly_ctx *ctx, ly_module_imp_clb clb, void *user_data)
{
    LY_CHECK_ARG_RET(ctx, ctx, );

    ctx->imp_clb = clb;
    ctx->imp_clb_data = user_data;

    /* new import callback - reset latests flags (possibly new revisions available) */
    for (uint32_t v = 0; v < ctx->list.count; ++v) {
        struct lys_module *mod = ctx->list.objs[v];

        mod->latest_revision &= ~LYS_MOD_LATEST_IMPCLB;
        if (mod->parsed && mod->parsed->includes) {
            for (LY_ARRAY_COUNT_TYPE u = 0; u < LY_ARRAY_COUNT(mod->parsed->includes); ++u) {
                mod->parsed->includes[u].submodule->latest_revision &= ~LYS_MOD_LATEST_IMPCLB;
            }
        }
    }
}